

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O1

LPWSTR __thiscall
CmdLineArgsParser::ParseString
          (CmdLineArgsParser *this,LPWSTR buffer,size_t ceBuffer,bool fTreatColonAsSeparator)

{
  WCHAR WVar1;
  LPWSTR pWVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  char16_t *pcVar6;
  WCHAR *pWVar7;
  bool bVar8;
  ulong uVar9;
  
  pWVar2 = this->pszCurrentArg;
  if (*pWVar2 == L'\"') {
    lVar5 = 0;
    for (uVar3 = 0; WVar1 = pWVar2[uVar3 + 1], WVar1 != L'\"'; uVar3 = uVar3 + 1) {
      if (WVar1 == L'\0') {
        this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (2 - lVar5));
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar6 = L"Unmatched quote";
        goto LAB_001e442b;
      }
      if (ceBuffer - 1 == uVar3) {
        this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (2 - lVar5));
LAB_001e441a:
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar6 = L"String token too large to parse";
        goto LAB_001e442b;
      }
      buffer[uVar3] = WVar1;
      lVar5 = lVar5 + -2;
    }
    this->pszCurrentArg = (LPWSTR)((long)pWVar2 + (4 - lVar5));
  }
  else {
    pWVar7 = this->pszCurrentArg;
    bVar8 = false;
    uVar3 = 0;
    do {
      uVar9 = (ulong)(ushort)*pWVar7;
      if ((uVar9 < 0x3e) &&
         (((0x100100000001U >> (uVar9 & 0x3f) & 1) != 0 ||
          (((0x2400200000000000U >> (uVar9 & 0x3f) & 1) != 0 && (fTreatColonAsSeparator)))))) {
        bVar8 = true;
      }
      else {
        if (0x1fe < uVar3) goto LAB_001e441a;
        buffer[uVar3] = *pWVar7;
        uVar3 = uVar3 + 1;
        pWVar7 = pWVar7 + 1;
        this->pszCurrentArg = pWVar7;
      }
    } while (!bVar8);
  }
  if (uVar3 != 0) {
    buffer[uVar3] = L'\0';
    return buffer;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar6 = L"String Token Expected";
LAB_001e442b:
  *puVar4 = pcVar6;
  __cxa_throw(puVar4,&Exception::typeinfo,0);
}

Assistant:

LPWSTR
CmdLineArgsParser::ParseString(__inout_ecount(ceBuffer) LPWSTR buffer, size_t ceBuffer, bool fTreatColonAsSeparator)
{

    char16 *out = buffer;
    size_t len = 0;

    if('"' == CurChar())
    {
        NextChar();

        while('"' != CurChar())
        {
            if(0 == CurChar())
            {
                throw Exception(_u("Unmatched quote"));
            }

            //
            // MaxTokenSize - 1 because we need 1 extra position for null termination
            //
            if (len >= ceBuffer - 1)
            {
                throw Exception(_u("String token too large to parse"));
            }

            out[len++] = CurChar();

            NextChar();
        }
        NextChar();
    }
    else
    {
        bool fDone = false;

        while(!fDone)
        {
            switch(CurChar())
            {
            case ' ':
            case ',':
            case 0:
                fDone = true;
                break;
            case '-':
            case '=':
            case ':':
                if (fTreatColonAsSeparator)
                {
                    fDone = true;
                    break;
                }
                else
                {
                    // Fallthrough
                }
            default:
                if (len >= MaxTokenSize - 1)
                {
                    throw Exception(_u("String token too large to parse"));
                }
                out[len++] = CurChar();
                NextChar();
            }
        }
    }

    if(0 == len)
    {
        throw Exception(_u("String Token Expected"));
    }

    out[len] = '\0';

    return buffer;
}